

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

int Abc_NtkCountInst_rec(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vOrder;
  Abc_Ntk_t *pNtk_local;
  
  local_30 = 0;
  if (pNtk->iStep < 0) {
    p = Abc_NtkDfsBoxes(pNtk);
    for (local_2c = 0; iVar1 = Vec_PtrSize(p), local_2c < iVar1; local_2c = local_2c + 1) {
      pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(p,local_2c);
      iVar1 = Abc_ObjIsBox(pObj_00);
      if ((iVar1 != 0) && ((Abc_Ntk_t *)(pObj_00->field_5).pData != pNtk)) {
        iVar1 = Abc_NtkCountInst_rec((Abc_Ntk_t *)(pObj_00->field_5).pData);
        local_30 = iVar1 + local_30;
      }
    }
    Vec_PtrFree(p);
    pNtk_local._4_4_ = local_30 + 1;
    pNtk->iStep = pNtk_local._4_4_;
  }
  else {
    pNtk_local._4_4_ = pNtk->iStep;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkCountInst_rec( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    if ( pNtk->iStep >= 0 )
        return pNtk->iStep;
    vOrder = Abc_NtkDfsBoxes( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        if ( Abc_ObjIsBox(pObj) && (Abc_Ntk_t *)pObj->pData != pNtk )
            Counter += Abc_NtkCountInst_rec( (Abc_Ntk_t *)pObj->pData );
    Vec_PtrFree( vOrder );
    return pNtk->iStep = 1 + Counter;
}